

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::OptConstFoldBinaryWasm<int>
          (GlobOpt *this,Instr **pInstr,Value *src1,Value *src2,Value **pDstVal)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  OpndKind OVar5;
  JITTimeFunctionBody *this_00;
  RegOpnd *dst;
  undefined4 *puVar6;
  long local_48;
  int64 tmpValueOut;
  int local_38;
  int src1IntConstantValue;
  int src2IntConstantValue;
  
  bVar3 = DoConstFold(this);
  if ((bVar3) && (src1 != (Value *)0x0)) {
    bVar4 = ValueInfo::TryGetIntConstantValue
                      (src1->valueInfo,(int32 *)((long)&tmpValueOut + 4),false);
    bVar3 = false;
    if ((src2 != (Value *)0x0) && (bVar3 = false, bVar4)) {
      bVar3 = false;
      bVar4 = ValueInfo::TryGetIntConstantValue(src2->valueInfo,&local_38,false);
      if (bVar4) {
        pIVar1 = *pInstr;
        src1IntConstantValue = local_38;
        this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        bVar3 = JITTimeFunctionBody::IsWasmFunction(this_00);
        bVar3 = IR::Instr::BinaryCalculatorT<int>
                          (pIVar1,tmpValueOut._4_4_,src1IntConstantValue,&local_48,bVar3);
        if (bVar3) {
          CaptureByteCodeSymUses(this,*pInstr);
          bVar4 = IRType_IsInt64((*pInstr)->m_dst->m_type);
          if (bVar4) {
            dst = (RegOpnd *)ReplaceWConst<long>(this,pInstr,local_48,pDstVal);
          }
          else {
            dst = (RegOpnd *)ReplaceWConst<int>(this,pInstr,(int)local_48,pDstVal);
          }
          pIVar1 = *pInstr;
          pIVar1->m_opcode = Ld_I4;
          OVar5 = IR::Opnd::GetKind(&dst->super_Opnd);
          if (OVar5 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar4) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar6 = 0;
          }
          ToInt32Dst(this,pIVar1,dst,this->currentBlock);
        }
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool GlobOpt::OptConstFoldBinaryWasm(
    IR::Instr** pInstr,
    const Value* src1,
    const Value* src2,
    Value **pDstVal)
{
    IR::Instr* &instr = *pInstr;

    if (!DoConstFold())
    {
        return false;
    }

    T src1IntConstantValue, src2IntConstantValue;
    if (!src1 || !src1->GetValueInfo()->TryGetIntConstantValue(&src1IntConstantValue, false) || //a bit sketchy: false for int32 means likelyInt = false
        !src2 || !src2->GetValueInfo()->TryGetIntConstantValue(&src2IntConstantValue, false)    //and unsigned = false for int64
        )
    {
        return false;
    }

    int64 tmpValueOut;
    if (!instr->BinaryCalculatorT<T>(src1IntConstantValue, src2IntConstantValue, &tmpValueOut, func->GetJITFunctionBody()->IsWasmFunction()))
    {
        return false;
    }

    this->CaptureByteCodeSymUses(instr);

    IR::Opnd *dst = (instr->GetDst()->IsInt64()) ? //dst can be int32 for int64 comparison operators
        ReplaceWConst(pInstr, tmpValueOut, pDstVal) :
        ReplaceWConst(pInstr, (int)tmpValueOut, pDstVal);

    instr->m_opcode = Js::OpCode::Ld_I4;
    this->ToInt32Dst(instr, dst->AsRegOpnd(), this->currentBlock);
    return true;
}